

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O0

easm_insn * dis_parse_insn(disctx *ctx,dis_status *status)

{
  int iVar1;
  easm_insn *peVar2;
  easm_subinsn **ppeVar3;
  easm_subinsn *peVar4;
  easm_insn *res;
  dis_status *pdStack_18;
  int spos;
  dis_status *status_local;
  disctx *ctx_local;
  
  res._4_4_ = DIS_STATUS_OK;
  pdStack_18 = status;
  status_local = (dis_status *)ctx;
  peVar2 = (easm_insn *)calloc(0x28,1);
  if (peVar2->subinsnsmax <= peVar2->subinsnsnum) {
    if (peVar2->subinsnsmax == 0) {
      peVar2->subinsnsmax = 0x10;
    }
    else {
      peVar2->subinsnsmax = peVar2->subinsnsmax << 1;
    }
    ppeVar3 = (easm_subinsn **)realloc(peVar2->subinsns,(long)peVar2->subinsnsmax << 3);
    peVar2->subinsns = ppeVar3;
  }
  peVar4 = dis_parse_subinsn((disctx *)status_local,pdStack_18,(int *)((long)&res + 4));
  iVar1 = peVar2->subinsnsnum;
  peVar2->subinsnsnum = iVar1 + 1;
  peVar2->subinsns[iVar1] = peVar4;
  if (res._4_4_ != status_local[8]) {
    abort();
  }
  return peVar2;
}

Assistant:

static struct easm_insn *dis_parse_insn(struct disctx *ctx, enum dis_status *status) {
	int spos = 0;
	struct easm_insn *res = calloc(sizeof *res, 1);
	ADDARRAY(res->subinsns, dis_parse_subinsn(ctx, status, &spos));
	if (spos != ctx->atomsnum)
		abort();
	return res;
}